

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void drawnumber_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  t_scalar *sc;
  _glist *owner;
  t_template *template;
  int iVar1;
  t_symbol *ptVar2;
  size_t sVar3;
  _instancetemplate *p_Var4;
  char *fmt;
  t_float tVar5;
  double newf;
  t_atom at;
  char sbuf [1000];
  double local_430;
  t_atom local_428;
  char local_418 [1008];
  
  iVar1 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
  if (iVar1 == 0) {
    fmt = "drawnumber_motion: scalar disappeared";
LAB_0015c473:
    post(fmt);
    return;
  }
  iVar1 = (int)fkey;
  if (iVar1 == 0) {
    return;
  }
  p_Var4 = (pd_maininstance.pd_gui)->i_template;
  if (*(int *)(p_Var4 + 0x108) != 0) {
    if (*(int *)(p_Var4 + 0x108) == 1) {
      if (*(int *)(p_Var4 + 0x10c) != 0) {
        return;
      }
      ptVar2 = template_getsymbol(*(t_template **)(p_Var4 + 0xe8),*(t_symbol **)((long)z + 0x30),
                                  *(t_word **)(p_Var4 + 0xe0),1);
      strncpy(local_418,ptVar2->s_name,1000);
      return;
    }
    fmt = "typing at text fields not yet implemented";
    goto LAB_0015c473;
  }
  if (*(int *)(p_Var4 + 0x10c) == 0) {
    tVar5 = template_getfloat(*(t_template **)(p_Var4 + 0xe8),*(t_symbol **)((long)z + 0x30),
                              *(t_word **)(p_Var4 + 0xe0),1);
    sprintf(local_418,"%g",(double)tVar5);
    p_Var4 = (pd_maininstance.pd_gui)->i_template;
  }
  else {
    local_418[0] = '\0';
  }
  *(uint *)(p_Var4 + 0x10c) = (uint)(iVar1 == 10);
  if (iVar1 == 8) {
    if (local_418[0] == '\0') goto LAB_0015c543;
    sVar3 = strlen(local_418);
    sVar3 = sVar3 - 1;
    iVar1 = 0;
  }
  else {
    sVar3 = strlen(local_418);
    local_418[sVar3 + 1] = '\0';
    sVar3 = strlen(local_418);
  }
  local_418[sVar3] = (char)iVar1;
LAB_0015c543:
  iVar1 = __isoc99_sscanf(local_418,"%lg",&local_430);
  if (iVar1 < 1) {
    local_430 = 0.0;
    tVar5 = 0.0;
  }
  else {
    tVar5 = (t_float)local_430;
  }
  template_setfloat(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                    *(t_symbol **)((long)z + 0x30),
                    *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),tVar5,1);
  p_Var4 = (pd_maininstance.pd_gui)->i_template;
  sc = *(t_scalar **)(p_Var4 + 0xd0);
  if (sc != (t_scalar *)0x0) {
    owner = *(_glist **)(p_Var4 + 200);
    template = *(t_template **)(p_Var4 + 0xe8);
    ptVar2 = gensym("change");
    template_notifyforscalar(template,owner,sc,ptVar2,1,&local_428);
    p_Var4 = (pd_maininstance.pd_gui)->i_template;
    if (*(t_scalar **)(p_Var4 + 0xd0) != (t_scalar *)0x0) {
      scalar_redraw(*(t_scalar **)(p_Var4 + 0xd0),*(_glist **)(p_Var4 + 200));
      p_Var4 = (pd_maininstance.pd_gui)->i_template;
    }
  }
  if (*(_array **)(p_Var4 + 0xd8) != (_array *)0x0) {
    array_redraw(*(_array **)(p_Var4 + 0xd8),*(_glist **)(p_Var4 + 200));
  }
  return;
}

Assistant:

static void drawnumber_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_drawnumber *x = (t_drawnumber *)z;
    int key = fkey;
    char sbuf[MAXPDSTRING];
    t_atom at;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (key == 0)
        return;
    if (TEMPLATE->drawnumber_motion_type == DT_SYMBOL)
    {
            /* key entry for a symbol field */
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else strncpy(sbuf,
            template_getsymbol(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1)->s_name,
                MAXPDSTRING);
        sbuf[MAXPDSTRING-1] = 0;
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
    }
    else if (TEMPLATE->drawnumber_motion_type == DT_FLOAT)
    {
            /* key entry for a numeric field.  This is just a stopgap. */
        double newf;
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else sprintf(sbuf, "%g",
            template_getfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1));
        TEMPLATE->drawnumber_motion_firstkey = (key == '\n');
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
        if (sscanf(sbuf, "%lg", &newf) < 1)
            newf = 0;
        template_setfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, (t_float)newf, 1);
        if (TEMPLATE->drawnumber_motion_scalar)
            template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
                TEMPLATE->drawnumber_motion_glist,
                    TEMPLATE->drawnumber_motion_scalar,
                    gensym("change"), 1, &at);
        if (TEMPLATE->drawnumber_motion_scalar)
            scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
                TEMPLATE->drawnumber_motion_glist);
        if (TEMPLATE->drawnumber_motion_array)
            array_redraw(TEMPLATE->drawnumber_motion_array,
                TEMPLATE->drawnumber_motion_glist);
    }
    else post("typing at text fields not yet implemented");
}